

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utRemoveComponent.cpp
# Opt level: O3

void __thiscall RemoveVCProcessTest::SetUp(RemoveVCProcessTest *this)

{
  RemoveVCProcessTest *pRVar1;
  bool bVar2;
  RemoveVCProcess *this_00;
  aiScene *this_01;
  aiMesh **ppaVar3;
  aiMesh *paVar4;
  aiMesh *paVar5;
  aiVector3D *paVar6;
  aiAnimation **ppaVar7;
  aiAnimation *paVar8;
  aiTexture **ppaVar9;
  aiTexture *paVar10;
  aiMaterial **ppaVar11;
  aiMaterial *paVar12;
  aiLight **ppaVar13;
  aiLight *paVar14;
  aiCamera **ppaVar15;
  aiCamera *paVar16;
  char *message;
  AssertionResult gtest_ar;
  char check [10];
  Message local_68;
  AssertHelper local_60;
  RemoveVCProcessTest *local_58;
  internal local_50 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  char local_3a [10];
  
  this_00 = (RemoveVCProcess *)operator_new(0x28);
  Assimp::RemoveVCProcess::RemoveVCProcess(this_00);
  this->piProcess = this_00;
  this_01 = (aiScene *)operator_new(0x80);
  aiScene::aiScene(this_01);
  this->pScene = this_01;
  this_01->mNumMeshes = 2;
  ppaVar3 = (aiMesh **)operator_new__(0x10);
  this_01->mMeshes = ppaVar3;
  paVar4 = (aiMesh *)operator_new(0x520);
  paVar4->mPrimitiveTypes = 0;
  paVar4->mNumVertices = 0;
  paVar4->mNumFaces = 0;
  local_58 = this;
  memset(&paVar4->mVertices,0,0xcc);
  paVar4->mBones = (aiBone **)0x0;
  paVar4->mMaterialIndex = 0;
  (paVar4->mName).length = 0;
  (paVar4->mName).data[0] = '\0';
  memset((paVar4->mName).data + 1,0x1b,0x3ff);
  paVar4->mNumAnimMeshes = 0;
  paVar4->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar4->mMethod = 0;
  (paVar4->mAABB).mMin.x = 0.0;
  (paVar4->mAABB).mMin.y = 0.0;
  (paVar4->mAABB).mMin.z = 0.0;
  (paVar4->mAABB).mMax.x = 0.0;
  (paVar4->mAABB).mMax.y = 0.0;
  (paVar4->mAABB).mMax.z = 0.0;
  memset(paVar4->mColors,0,0xa0);
  *ppaVar3 = paVar4;
  paVar5 = (aiMesh *)operator_new(0x520);
  paVar5->mPrimitiveTypes = 0;
  paVar5->mNumVertices = 0;
  paVar5->mNumFaces = 0;
  memset(&paVar5->mVertices,0,0xcc);
  paVar5->mBones = (aiBone **)0x0;
  paVar5->mMaterialIndex = 0;
  (paVar5->mName).length = 0;
  (paVar5->mName).data[0] = '\0';
  memset((paVar5->mName).data + 1,0x1b,0x3ff);
  paVar5->mNumAnimMeshes = 0;
  paVar5->mAnimMeshes = (aiAnimMesh **)0x0;
  paVar5->mMethod = 0;
  (paVar5->mAABB).mMin.x = 0.0;
  (paVar5->mAABB).mMin.y = 0.0;
  (paVar5->mAABB).mMin.z = 0.0;
  (paVar5->mAABB).mMax.x = 0.0;
  (paVar5->mAABB).mMax.y = 0.0;
  (paVar5->mAABB).mMax.z = 0.0;
  memset(paVar5->mColors,0,0xa0);
  ppaVar3[1] = paVar5;
  paVar4->mNumVertices = 0x78;
  paVar6 = (aiVector3D *)operator_new__(0x5a0);
  memset(paVar6,0,0x5a0);
  paVar4->mVertices = paVar6;
  paVar6 = (aiVector3D *)operator_new__(0x5a0);
  memset(paVar6,0,0x5a0);
  paVar4->mNormals = paVar6;
  paVar6 = (aiVector3D *)operator_new__(0x5a0);
  memset(paVar6,0,0x5a0);
  paVar4->mTextureCoords[0] = paVar6;
  paVar6 = (aiVector3D *)operator_new__(0x5a0);
  memset(paVar6,0,0x5a0);
  paVar4->mTextureCoords[1] = paVar6;
  paVar6 = (aiVector3D *)operator_new__(0x5a0);
  memset(paVar6,0,0x5a0);
  paVar4->mTextureCoords[2] = paVar6;
  paVar6 = (aiVector3D *)operator_new__(0x5a0);
  memset(paVar6,0,0x5a0);
  paVar4->mTextureCoords[3] = paVar6;
  paVar5->mNumVertices = 0x78;
  paVar6 = (aiVector3D *)operator_new__(0x5a0);
  memset(paVar6,0,0x5a0);
  pRVar1 = local_58;
  paVar5->mVertices = paVar6;
  this_01->mNumAnimations = 2;
  ppaVar7 = (aiAnimation **)operator_new__(0x10);
  this_01->mAnimations = ppaVar7;
  paVar8 = (aiAnimation *)operator_new(0x448);
  (paVar8->mName).length = 0;
  (paVar8->mName).data[0] = '\0';
  memset((paVar8->mName).data + 1,0x1b,0x3ff);
  paVar8->mDuration = -1.0;
  paVar8->mTicksPerSecond = 0.0;
  paVar8->mNumChannels = 0;
  paVar8->mChannels = (aiNodeAnim **)0x0;
  paVar8->mNumMeshChannels = 0;
  paVar8->mMeshChannels = (aiMeshAnim **)0x0;
  paVar8->mNumMorphMeshChannels = 0;
  paVar8->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
  *pRVar1->pScene->mAnimations = paVar8;
  paVar8 = (aiAnimation *)operator_new(0x448);
  (paVar8->mName).length = 0;
  (paVar8->mName).data[0] = '\0';
  memset((paVar8->mName).data + 1,0x1b,0x3ff);
  paVar8->mDuration = -1.0;
  paVar8->mTicksPerSecond = 0.0;
  paVar8->mNumChannels = 0;
  paVar8->mChannels = (aiNodeAnim **)0x0;
  paVar8->mNumMeshChannels = 0;
  paVar8->mMeshChannels = (aiMeshAnim **)0x0;
  paVar8->mNumMorphMeshChannels = 0;
  paVar8->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
  pRVar1->pScene->mAnimations[1] = paVar8;
  pRVar1->pScene->mNumTextures = 2;
  ppaVar9 = (aiTexture **)operator_new__(0x10);
  pRVar1->pScene->mTextures = ppaVar9;
  paVar10 = (aiTexture *)operator_new(0x428);
  paVar10->mWidth = 0;
  paVar10->mHeight = 0;
  paVar10->pcData = (aiTexel *)0x0;
  (paVar10->mFilename).length = 0;
  (paVar10->mFilename).data[0] = '\0';
  memset((paVar10->mFilename).data + 1,0x1b,0x3ff);
  paVar10->achFormatHint[0] = '\0';
  paVar10->achFormatHint[1] = '\0';
  paVar10->achFormatHint[2] = '\0';
  paVar10->achFormatHint[3] = '\0';
  *pRVar1->pScene->mTextures = paVar10;
  paVar10 = (aiTexture *)operator_new(0x428);
  paVar10->mWidth = 0;
  paVar10->mHeight = 0;
  paVar10->pcData = (aiTexel *)0x0;
  (paVar10->mFilename).length = 0;
  (paVar10->mFilename).data[0] = '\0';
  memset((paVar10->mFilename).data + 1,0x1b,0x3ff);
  paVar10->achFormatHint[0] = '\0';
  paVar10->achFormatHint[1] = '\0';
  paVar10->achFormatHint[2] = '\0';
  paVar10->achFormatHint[3] = '\0';
  pRVar1->pScene->mTextures[1] = paVar10;
  pRVar1->pScene->mNumMaterials = 2;
  ppaVar11 = (aiMaterial **)operator_new__(0x10);
  pRVar1->pScene->mMaterials = ppaVar11;
  paVar12 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(paVar12);
  *pRVar1->pScene->mMaterials = paVar12;
  paVar12 = (aiMaterial *)operator_new(0x10);
  aiMaterial::aiMaterial(paVar12);
  pRVar1->pScene->mMaterials[1] = paVar12;
  pRVar1->pScene->mNumLights = 2;
  ppaVar13 = (aiLight **)operator_new__(0x10);
  pRVar1->pScene->mLights = ppaVar13;
  paVar14 = (aiLight *)operator_new(0x46c);
  (paVar14->mName).length = 0;
  (paVar14->mName).data[0] = '\0';
  memset((paVar14->mName).data + 1,0x1b,0x3ff);
  paVar14->mType = aiLightSource_UNDEFINED;
  (paVar14->mPosition).x = 0.0;
  (paVar14->mPosition).y = 0.0;
  (paVar14->mPosition).z = 0.0;
  (paVar14->mDirection).x = 0.0;
  (paVar14->mDirection).y = 0.0;
  *(undefined8 *)&(paVar14->mDirection).z = 0;
  (paVar14->mUp).x = 0.0;
  (paVar14->mUp).y = 0.0;
  *(undefined8 *)&(paVar14->mUp).z = 0;
  paVar14->mAttenuationLinear = 1.0;
  paVar14->mAttenuationQuadratic = 0.0;
  (paVar14->mColorDiffuse).r = 0.0;
  (paVar14->mColorDiffuse).g = 0.0;
  (paVar14->mColorDiffuse).b = 0.0;
  (paVar14->mColorSpecular).r = 0.0;
  (paVar14->mColorSpecular).g = 0.0;
  *(undefined8 *)&(paVar14->mColorSpecular).b = 0;
  (paVar14->mColorAmbient).g = 0.0;
  (paVar14->mColorAmbient).b = 0.0;
  paVar14->mAngleInnerCone = 6.2831855;
  paVar14->mAngleOuterCone = 6.2831855;
  (paVar14->mSize).x = 0.0;
  (paVar14->mSize).y = 0.0;
  *pRVar1->pScene->mLights = paVar14;
  paVar14 = (aiLight *)operator_new(0x46c);
  (paVar14->mName).length = 0;
  (paVar14->mName).data[0] = '\0';
  memset((paVar14->mName).data + 1,0x1b,0x3ff);
  paVar14->mType = aiLightSource_UNDEFINED;
  (paVar14->mPosition).x = 0.0;
  (paVar14->mPosition).y = 0.0;
  (paVar14->mPosition).z = 0.0;
  (paVar14->mDirection).x = 0.0;
  (paVar14->mDirection).y = 0.0;
  *(undefined8 *)&(paVar14->mDirection).z = 0;
  (paVar14->mUp).x = 0.0;
  (paVar14->mUp).y = 0.0;
  *(undefined8 *)&(paVar14->mUp).z = 0;
  paVar14->mAttenuationLinear = 1.0;
  paVar14->mAttenuationQuadratic = 0.0;
  (paVar14->mColorDiffuse).r = 0.0;
  (paVar14->mColorDiffuse).g = 0.0;
  (paVar14->mColorDiffuse).b = 0.0;
  (paVar14->mColorSpecular).r = 0.0;
  (paVar14->mColorSpecular).g = 0.0;
  *(undefined8 *)&(paVar14->mColorSpecular).b = 0;
  (paVar14->mColorAmbient).g = 0.0;
  (paVar14->mColorAmbient).b = 0.0;
  paVar14->mAngleInnerCone = 6.2831855;
  paVar14->mAngleOuterCone = 6.2831855;
  (paVar14->mSize).x = 0.0;
  (paVar14->mSize).y = 0.0;
  pRVar1->pScene->mLights[1] = paVar14;
  pRVar1->pScene->mNumCameras = 2;
  ppaVar15 = (aiCamera **)operator_new__(0x10);
  pRVar1->pScene->mCameras = ppaVar15;
  paVar16 = (aiCamera *)operator_new(0x438);
  (paVar16->mName).length = 0;
  (paVar16->mName).data[0] = '\0';
  memset((paVar16->mName).data + 1,0x1b,0x3ff);
  (paVar16->mPosition).x = 0.0;
  (paVar16->mPosition).y = 0.0;
  *(undefined8 *)&(paVar16->mPosition).z = 0;
  (paVar16->mUp).y = 1.0;
  (paVar16->mUp).z = 0.0;
  (paVar16->mLookAt).x = 0.0;
  (paVar16->mLookAt).y = 0.0;
  *(undefined8 *)&(paVar16->mLookAt).z = 0x3f490fdb3f800000;
  paVar16->mClipPlaneNear = 0.1;
  paVar16->mClipPlaneFar = 1000.0;
  paVar16->mAspect = 0.0;
  *pRVar1->pScene->mCameras = paVar16;
  paVar16 = (aiCamera *)operator_new(0x438);
  (paVar16->mName).length = 0;
  (paVar16->mName).data[0] = '\0';
  memset((paVar16->mName).data + 1,0x1b,0x3ff);
  (paVar16->mPosition).x = 0.0;
  (paVar16->mPosition).y = 0.0;
  *(undefined8 *)&(paVar16->mPosition).z = 0;
  (paVar16->mUp).y = 1.0;
  (paVar16->mUp).z = 0.0;
  (paVar16->mLookAt).x = 0.0;
  (paVar16->mLookAt).y = 0.0;
  *(undefined8 *)&(paVar16->mLookAt).z = 0x3f490fdb3f800000;
  paVar16->mClipPlaneNear = 0.1;
  paVar16->mClipPlaneFar = 1000.0;
  paVar16->mAspect = 0.0;
  pRVar1->pScene->mCameras[1] = paVar16;
  local_3a[0] = '\0';
  local_68.ss_.ptr_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,char>(local_50,"0","check[0]",(int *)&local_68,local_3a);
  if (local_50[0] == (internal)0x0) {
    testing::Message::Message(&local_68);
    if (local_48.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_48.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utRemoveComponent.cpp"
               ,0x6e,message);
    testing::internal::AssertHelper::operator=(&local_60,&local_68);
    testing::internal::AssertHelper::~AssertHelper(&local_60);
    if (CONCAT44(local_68.ss_.ptr_._4_4_,local_68.ss_.ptr_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_68.ss_.ptr_._4_4_,local_68.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_68.ss_.ptr_._4_4_,local_68.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

void RemoveVCProcessTest::SetUp()
{
    // construct the process
    piProcess = new RemoveVCProcess();
    pScene = new aiScene();

    // fill the scene ..
    pScene->mMeshes = new aiMesh*[pScene->mNumMeshes = 2];
    pScene->mMeshes[0] = new aiMesh();
    pScene->mMeshes[1] = new aiMesh();

    pScene->mMeshes[0]->mNumVertices = 120;
    pScene->mMeshes[0]->mVertices = new aiVector3D[120];
    pScene->mMeshes[0]->mNormals = new aiVector3D[120];
    pScene->mMeshes[0]->mTextureCoords[0] = new aiVector3D[120];
    pScene->mMeshes[0]->mTextureCoords[1] = new aiVector3D[120];
    pScene->mMeshes[0]->mTextureCoords[2] = new aiVector3D[120];
    pScene->mMeshes[0]->mTextureCoords[3] = new aiVector3D[120];

    pScene->mMeshes[1]->mNumVertices = 120;
    pScene->mMeshes[1]->mVertices = new aiVector3D[120];

    pScene->mAnimations    = new aiAnimation*[pScene->mNumAnimations = 2];
    pScene->mAnimations[0] = new aiAnimation();
    pScene->mAnimations[1] = new aiAnimation();

    pScene->mTextures = new aiTexture*[pScene->mNumTextures = 2];
    pScene->mTextures[0] = new aiTexture();
    pScene->mTextures[1] = new aiTexture();

    pScene->mMaterials    = new aiMaterial*[pScene->mNumMaterials = 2];
    pScene->mMaterials[0] = new aiMaterial();
    pScene->mMaterials[1] = new aiMaterial();

    pScene->mLights    = new aiLight*[pScene->mNumLights = 2];
    pScene->mLights[0] = new aiLight();
    pScene->mLights[1] = new aiLight();

    pScene->mCameras    = new aiCamera*[pScene->mNumCameras = 2];
    pScene->mCameras[0] = new aiCamera();
    pScene->mCameras[1] = new aiCamera();

    // COMPILE TEST: aiMaterial may no add any extra members,
    // so we don't need a virtual destructor
    char check[sizeof(aiMaterial) == sizeof(aiMaterial) ? 10 : -1];
    check[0] = 0;
    // to remove compiler warning
    EXPECT_EQ( 0, check[0] );
}